

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O0

void __thiscall CTPNObjProp::gen_code(CTPNObjProp *this,int param_2,int param_3)

{
  tctarg_prop_id_t tVar1;
  tc_prop_id tVar2;
  int iVar3;
  CTcDataStream *this_00;
  CTcSymObjBase *this_01;
  CTcDataStream *pCVar4;
  long in_RDI;
  CTPNDstr *dstr;
  CTcDataStream *str;
  char buf [5];
  vm_val_t val;
  undefined4 in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  CTcDataStream *in_stack_ffffffffffffff60;
  CTcGenTarg *buf_00;
  CTcDataStream *in_stack_ffffffffffffff68;
  CTcAbsFixup **in_stack_ffffffffffffff70;
  ulong in_stack_ffffffffffffff90;
  CTcDataStream *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  CTcGenTarg *in_stack_ffffffffffffffb0;
  CTcConstVal *in_stack_ffffffffffffffc8;
  CTPNDstrBase *this_02;
  CTcDataStream *in_stack_ffffffffffffffd8;
  CTcGenTarg *in_stack_ffffffffffffffe0;
  
  CTPNObjDef::get_obj_sym(*(CTPNObjDef **)(in_RDI + 0x20));
  this_00 = CTcSymObjBase::get_stream((CTcSymObjBase *)0x2dfe7b);
  CTcTokenizer::set_line_info(G_tok,*(CTcTokFileDesc **)(in_RDI + 0x10),*(long *)(in_RDI + 0x18));
  if (*(long *)(in_RDI + 0x48) == 0) {
    if (*(long *)(in_RDI + 0x38) != 0) {
      iVar3 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x2e0019);
      if (iVar3 == 0) {
        iVar3 = (**(code **)(**(long **)(in_RDI + 0x38) + 0x38))();
        if (iVar3 == 0) {
          CTcTokenizer::throw_internal_error(0x3aa6);
        }
        this_02 = *(CTPNDstrBase **)(in_RDI + 0x38);
        buf_00 = G_cg;
        CTPNDstrBase::get_str(this_02);
        CTPNDstrBase::get_str_len(this_02);
        pCVar4 = this_00;
        CTcDataStream::get_ofs(this_00);
        CTcGenTarg::add_const_str
                  (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                   in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
        vm_val_t::set_dstring((vm_val_t *)&stack0xffffffffffffffe0,0);
        vmb_put_dh((char *)buf_00,
                   (vm_val_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        CTcDataStream::write(pCVar4,(int)&stack0xffffffffffffffdb,(void *)0x5,(size_t)this_00);
      }
      else {
        CTcDataStream::get_ofs(this_00);
        (**(code **)(**(long **)(in_RDI + 0x38) + 8))();
        CTcGenTarg::write_const_as_dh
                  (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(ulong)this_00,
                   in_stack_ffffffffffffffc8);
      }
    }
  }
  else {
    tVar1 = CTcSymPropBase::get_prop(*(CTcSymPropBase **)(in_RDI + 0x28));
    tVar2 = CTcParser::get_constructor_prop(G_prs);
    pCVar4 = (CTcDataStream *)(ulong)tVar2;
    if (tVar1 == tVar2) {
      CTPNCodeBody::set_constructor(*(CTPNCodeBody **)(in_RDI + 0x48),1);
    }
    if ((*(byte *)(in_RDI + 0x58) & 1) != 0) {
      CTPNCodeBody::set_static(*(CTPNCodeBody **)(in_RDI + 0x48));
      this_01 = &CTPNObjDef::get_obj_sym(*(CTPNObjDef **)(in_RDI + 0x20))->super_CTcSymObjBase;
      CTcSymObjBase::get_obj_id(this_01);
      CTcDataStream::write_obj_id
                (in_stack_ffffffffffffff60,
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      pCVar4 = G_static_init_id_stream;
      CTcSymPropBase::get_prop(*(CTcSymPropBase **)(in_RDI + 0x28));
      CTcDataStream::write_prop_id(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    }
    (**(code **)**(undefined8 **)(in_RDI + 0x48))();
    vm_val_t::set_codeofs((vm_val_t *)&stack0xffffffffffffffe0,0);
    CTPNCodeBodyBase::get_fixup_list_head(*(CTPNCodeBodyBase **)(in_RDI + 0x48));
    CTcDataStream::get_ofs(this_00);
    CTcAbsFixup::add_abs_fixup
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(ulong)in_stack_ffffffffffffff60)
    ;
    vmb_put_dh((char *)in_stack_ffffffffffffff60,
               (vm_val_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    CTcDataStream::write(this_00,(int)&stack0xffffffffffffffdb,(void *)0x5,(size_t)pCVar4);
  }
  return;
}

Assistant:

void CTPNObjProp::gen_code(int, int)
{
    vm_val_t val;
    char buf[VMB_DATAHOLDER];

    /* get the correct data stream */
    CTcDataStream *str = objdef_->get_obj_sym()->get_stream();

    /* set the current source location for error reporting */
    G_tok->set_line_info(file_, linenum_);

    /* generate code for our expression or our code body, as appropriate */
    if (code_body_ != 0)
    {
        /* if this is a constructor, mark the code body accordingly */
        if (prop_sym_->get_prop() == G_prs->get_constructor_prop())
            code_body_->set_constructor(TRUE);

        /* if it's static, do some extra work */
        if (is_static_)
        {
            /* mark the code body as static */
            code_body_->set_static();

            /* 
             *   add the obj.prop to the static ID stream, so the VM knows to
             *   invoke this initializer at start-up 
             */
            G_static_init_id_stream
                ->write_obj_id(objdef_->get_obj_sym()->get_obj_id());
            G_static_init_id_stream
                ->write_prop_id(prop_sym_->get_prop());
        }

        /* tell our code body to generate the code */
        code_body_->gen_code(FALSE, FALSE);

        /* 
         *   Set up our code offset value.  Write a code offset of zero for
         *   now, since we won't know the correct offset until link time.  
         */
        val.set_codeofs(0);

        /* 
         *   Add a fixup to the code body's fixup list for our dataholder, so
         *   that we fix up the property value when we link.  Note that the
         *   fixup is one byte into our object stream from the current
         *   offset, because the first byte is the type.  
         */
        CTcAbsFixup::add_abs_fixup(code_body_->get_fixup_list_head(),
                                   str, str->get_ofs() + 1);
        
        /* write out our value in DATAHOLDER format */
        vmb_put_dh(buf, &val);
        str->write(buf, VMB_DATAHOLDER);
    }
    else if (expr_ != 0)
    {
        /* 
         *   if my value is constant, write out a dataholder for the constant
         *   value to the stream; otherwise, write out our code and store a
         *   pointer to the code 
         */
        if (expr_->is_const())
        {
            /* write the constant value to the object stream */
            G_cg->write_const_as_dh(str, str->get_ofs(),
                                    expr_->get_const_val());
        }
        else if (expr_->is_dstring())
        {
            /* it's a double-quoted string node */
            CTPNDstr *dstr = (CTPNDstr *)expr_;

            /* 
             *   Add the string to the constant pool.  Note that the fixup
             *   will be one byte from the current object stream offset,
             *   since we need to write the type byte first.  
             */
            G_cg->add_const_str(dstr->get_str(), dstr->get_str_len(),
                                str, str->get_ofs() + 1);

            /* 
             *   Set up the dstring value.  Use a zero placeholder for now;
             *   add_const_str() already added a fixup for us that will
             *   supply the correct value at link time.  
             */
            val.set_dstring(0);
            vmb_put_dh(buf, &val);
            str->write(buf, VMB_DATAHOLDER);
        }
        else
        {
            /* we should never get here */
            G_tok->throw_internal_error(TCERR_INVAL_PROP_CODE_GEN);
        }
    }
}